

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

void google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
               (int field_number,string *value,CodedOutputStream *output)

{
  bool bVar1;
  uint uVar2;
  byte *pbVar3;
  LogMessage *other;
  uint8_t *puVar4;
  byte *pbVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  LogFinisher local_61;
  LogMessage local_60;
  
  uVar7 = field_number << 3;
  pbVar5 = output->cur_;
  if ((output->impl_).end_ <= pbVar5) {
    pbVar5 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar5);
  }
  output->cur_ = pbVar5;
  *pbVar5 = (byte)uVar7 | 2;
  if (uVar7 < 0x80) {
    pbVar3 = pbVar5 + 1;
  }
  else {
    *pbVar5 = (byte)uVar7 | 0x82;
    pbVar5[1] = (byte)(uVar7 >> 7);
    pbVar3 = pbVar5 + 2;
    if (0x3fff < uVar7) {
      uVar2 = (uint)pbVar5[1];
      uVar7 = uVar7 >> 7;
      do {
        pbVar3[-1] = (byte)uVar2 | 0x80;
        uVar2 = uVar7 >> 7;
        *pbVar3 = (byte)uVar2;
        pbVar3 = pbVar3 + 1;
        bVar1 = 0x3fff < uVar7;
        uVar7 = uVar2;
      } while (bVar1);
    }
  }
  output->cur_ = pbVar3;
  if ((value->_M_string_length & 0xffffffff80000000) != 0) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/wire_format_lite.cc"
               ,0x1ee);
    other = LogMessage::operator<<(&local_60,"CHECK failed: (value.size()) <= (kInt32MaxSize): ");
    LogFinisher::operator=(&local_61,other);
    LogMessage::~LogMessage(&local_60);
  }
  uVar8 = value->_M_string_length;
  pbVar5 = output->cur_;
  if ((output->impl_).end_ <= pbVar5) {
    pbVar5 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar5);
  }
  output->cur_ = pbVar5;
  *pbVar5 = (byte)uVar8;
  if ((uint)uVar8 < 0x80) {
    pbVar3 = pbVar5 + 1;
  }
  else {
    *pbVar5 = (byte)uVar8 | 0x80;
    uVar6 = uVar8 >> 7 & 0x1ffffff;
    pbVar5[1] = (byte)uVar6;
    pbVar3 = pbVar5 + 2;
    if (0x3fff < (uint)uVar8) {
      uVar8 = (ulong)pbVar5[1];
      do {
        pbVar3[-1] = (byte)uVar8 | 0x80;
        uVar8 = uVar6 >> 7;
        *pbVar3 = (byte)uVar8;
        pbVar3 = pbVar3 + 1;
        uVar7 = (uint)uVar6;
        uVar6 = uVar8;
      } while (0x3fff < uVar7);
    }
  }
  output->cur_ = pbVar3;
  puVar4 = io::EpsCopyOutputStream::WriteRawMaybeAliased
                     (&output->impl_,(value->_M_dataplus)._M_p,(int)value->_M_string_length,pbVar3);
  output->cur_ = puVar4;
  return;
}

Assistant:

void WireFormatLite::WriteStringMaybeAliased(int field_number,
                                             const std::string& value,
                                             io::CodedOutputStream* output) {
  // String is for UTF-8 text only
  WriteTag(field_number, WIRETYPE_LENGTH_DELIMITED, output);
  GOOGLE_CHECK_LE(value.size(), kInt32MaxSize);
  output->WriteVarint32(value.size());
  output->WriteRawMaybeAliased(value.data(), value.size());
}